

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

ExtPubkey * __thiscall
cfd::core::DescriptorKeyInfo::GetExtPubkey
          (ExtPubkey *__return_storage_ptr__,DescriptorKeyInfo *this)

{
  ExtPubkey::ExtPubkey(__return_storage_ptr__,&this->extpubkey_);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey DescriptorKeyInfo::GetExtPubkey() const { return extpubkey_; }